

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_flops.cc
# Opt level: O0

float __thiscall benchmark_2::run_kernel(benchmark_2 *this,size_t iterations)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  ulong uVar6;
  uint uVar7;
  long in_RSI;
  long in_RDI;
  uint uVar8;
  float fVar9;
  undefined1 in_ZMM0 [64];
  __m256 r1;
  __m256 r0;
  undefined8 local_220;
  undefined8 uStackY_218;
  undefined8 uStackY_210;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1d8;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  
  uVar1 = rdtsc();
  uVar7 = (uint)((ulong)uVar1 >> 0x20);
  uVar6 = CONCAT44((int)((ulong)in_RDI >> 0x20),(int)uVar1) | (ulong)uVar7 << 0x20;
  auVar3 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,uVar6);
  uVar8 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar8),ZEXT416(uVar8),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar8),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar8),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar8),ZEXT416(uVar8),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar8),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar8),0x30);
  fVar9 = auVar3._0_4_;
  fVar10 = auVar3._4_4_;
  fVar11 = auVar3._8_4_;
  fVar12 = auVar3._12_4_;
  uVar13 = auVar2._0_4_;
  uVar14 = auVar2._4_4_;
  uStack_1e8 = auVar2._8_4_;
  uStack_1e4 = auVar2._12_4_;
  uVar1 = rdtsc();
  auVar3 = vcvtusi2ss_avx512f(auVar3,CONCAT44((int)(uVar6 >> 0x20),(int)uVar1) |
                                     CONCAT44(uVar7,(int)((ulong)uVar1 >> 0x20)) << 0x20);
  uVar7 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar7),ZEXT416(uVar7),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar7),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar7),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar7),ZEXT416(uVar7),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar7),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar7),0x30);
  local_180 = auVar2._0_8_;
  uStack_178 = auVar2._8_8_;
  uStack_170 = auVar3._0_8_;
  uStack_168 = auVar3._8_8_;
  local_220 = local_180;
  uStackY_218 = uStack_178;
  uStackY_210 = uStack_170;
  local_1d8 = in_RSI;
  do {
    auVar5._4_4_ = fVar10;
    auVar5._0_4_ = fVar9;
    auVar5._12_4_ = fVar12;
    auVar5._8_4_ = fVar11;
    auVar5._20_4_ = uVar14;
    auVar5._16_4_ = uVar13;
    auVar5._28_4_ = uStack_1e4;
    auVar5._24_4_ = uStack_1e8;
    auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),auVar5);
    fVar9 = auVar3._0_4_;
    fVar10 = auVar3._4_4_;
    fVar11 = auVar3._8_4_;
    fVar12 = auVar3._12_4_;
    uVar13 = 0;
    uVar14 = 0;
    uStack_1e8 = 0;
    uStack_1e4 = 0;
    auVar4._8_8_ = uStackY_218;
    auVar4._0_8_ = local_220;
    auVar4._16_8_ = uStackY_210;
    auVar4._24_8_ = uStack_168;
    auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),auVar4);
    local_220 = auVar3._0_8_;
    uStackY_218 = auVar3._8_8_;
    uStackY_210 = 0;
    uStack_168 = 0;
    local_1d8 = local_1d8 + -1;
  } while (local_1d8 != 0);
  local_80 = auVar3._0_4_;
  uStack_7c = auVar3._4_4_;
  uStack_78 = auVar3._8_4_;
  uStack_74 = auVar3._12_4_;
  fVar9 = __m256_reduce_add_ps
                    ((__m256)(ZEXT1632(CONCAT412(fVar12 + uStack_74,
                                                 CONCAT48(fVar11 + uStack_78,
                                                          CONCAT44(fVar10 + uStack_7c,
                                                                   fVar9 + local_80)))) << 0x40));
  return fVar9;
}

Assistant:

float run_kernel(size_t iterations) const override
    {
            __m256 r0 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r1 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            do{
                r0 = _mm256_fmadd_ps(mul0, mul1, r0);
                r1 = _mm256_fmadd_ps(mul0, mul1, r1);

            }while (--iterations);

            r0 = _mm256_add_ps(r0, r1);
            return __m256_reduce_add_ps(r0);
    }